

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVTools.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> *
Diligent::OptimizeSPIRV
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *SrcSPIRV,spv_target_env TargetEnv,
          SPIRV_OPTIMIZATION_FLAGS Passes)

{
  pointer puVar1;
  uint32_t *original_binary;
  bool bVar2;
  spv_validator_options options;
  uint uVar3;
  undefined4 in_register_0000000c;
  ValidatorOptions ValidatorOptions;
  OptimizerOptions Options;
  Optimizer SpirvOptimizer;
  code *local_48 [2];
  code *local_38;
  code *local_30;
  
  if (Passes == SPIRV_OPTIMIZATION_FLAG_NONE) {
    FormatString<char[26],char[39]>
              ((string *)&SpirvOptimizer,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Passes != SPIRV_OPTIMIZATION_FLAG_NONE",
               (char (*) [39])CONCAT44(in_register_0000000c,Passes));
    DebugAssertionFailed
              ((Char *)SpirvOptimizer.impl_._M_t.
                       super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
                       .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl,
               "OptimizeSPIRV",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVTools.cpp"
               ,0x70);
    std::__cxx11::string::~string((string *)&SpirvOptimizer);
  }
  if (TargetEnv == SPV_ENV_MAX) {
    puVar1 = (SrcSPIRV->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(SrcSPIRV->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar1) < 5) {
      TargetEnv = SPV_ENV_VULKAN_1_0;
    }
    else {
      uVar3 = puVar1[1];
      uVar3 = uVar3 << 0x18 | uVar3 - 0x10000 >> 8;
      if (uVar3 < 7) {
        TargetEnv = *(spv_target_env *)(&DAT_0070f1ec + (ulong)uVar3 * 4);
      }
      else {
        TargetEnv = SPV_ENV_VULKAN_1_3;
      }
    }
  }
  spvtools::Optimizer::Optimizer(&SpirvOptimizer,TargetEnv);
  local_48[1] = (code *)0x0;
  local_48[0] = anon_unknown_3::SpvOptimizerMessageConsumer;
  local_30 = std::
             _Function_handler<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*),_void_(*)(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*),_void_(*)(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
             ::_M_manager;
  spvtools::Optimizer::SetMessageConsumer(&SpirvOptimizer,(MessageConsumer *)local_48);
  std::_Function_base::~_Function_base((_Function_base *)local_48);
  Options.options_ = spvOptimizerOptionsCreate();
  if ((Passes & SPIRV_OPTIMIZATION_FLAG_LEGALIZATION) != SPIRV_OPTIMIZATION_FLAG_NONE) {
    spvtools::Optimizer::RegisterLegalizationPasses(&SpirvOptimizer);
    options = spvValidatorOptionsCreate();
    ValidatorOptions.options_ = options;
    spvValidatorOptionsSetBeforeHlslLegalization(options,true);
    spvOptimizerOptionsSetValidatorOptions(Options.options_,options);
    spvtools::ValidatorOptions::~ValidatorOptions(&ValidatorOptions);
  }
  if ((Passes & SPIRV_OPTIMIZATION_FLAG_PERFORMANCE) != SPIRV_OPTIMIZATION_FLAG_NONE) {
    spvtools::Optimizer::RegisterPerformancePasses(&SpirvOptimizer);
  }
  if ((Passes & SPIRV_OPTIMIZATION_FLAG_STRIP_REFLECTION) != SPIRV_OPTIMIZATION_FLAG_NONE) {
    spvtools::CreateStripReflectInfoPass();
    spvtools::Optimizer::RegisterPass(&SpirvOptimizer,(PassToken *)&ValidatorOptions);
    spvtools::Optimizer::PassToken::~PassToken((PassToken *)&ValidatorOptions);
  }
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  original_binary =
       (SrcSPIRV->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_start;
  bVar2 = spvtools::Optimizer::Run
                    (&SpirvOptimizer,original_binary,
                     (long)(SrcSPIRV->
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)original_binary >> 2,
                     __return_storage_ptr__,Options.options_);
  if ((!bVar2) &&
     (puVar1 = (__return_storage_ptr__->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start,
     (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
     _M_impl.super__Vector_impl_data._M_finish != puVar1)) {
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  spvtools::OptimizerOptions::~OptimizerOptions(&Options);
  spvtools::Optimizer::~Optimizer(&SpirvOptimizer);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> OptimizeSPIRV(const std::vector<uint32_t>& SrcSPIRV, spv_target_env TargetEnv, SPIRV_OPTIMIZATION_FLAGS Passes)
{
    VERIFY_EXPR(Passes != SPIRV_OPTIMIZATION_FLAG_NONE);

    if (TargetEnv == SPV_ENV_MAX)
        TargetEnv = SpvTargetEnvFromSPIRV(SrcSPIRV);

    spvtools::Optimizer SpirvOptimizer(TargetEnv);
    SpirvOptimizer.SetMessageConsumer(SpvOptimizerMessageConsumer);

    spvtools::OptimizerOptions Options;
#ifndef DILIGENT_DEVELOPMENT
    // Do not run validator in release build
    Options.set_run_validator(false);
#endif

    // SPIR-V bytecode generated from HLSL must be legalized to
    // turn it into a valid vulkan SPIR-V shader.
    if (Passes & SPIRV_OPTIMIZATION_FLAG_LEGALIZATION)
    {
        SpirvOptimizer.RegisterLegalizationPasses();

        spvtools::ValidatorOptions ValidatorOptions;
        ValidatorOptions.SetBeforeHlslLegalization(true);
        Options.set_validator_options(ValidatorOptions);
    }

    if (Passes & SPIRV_OPTIMIZATION_FLAG_PERFORMANCE)
    {
        SpirvOptimizer.RegisterPerformancePasses();
    }

    if (Passes & SPIRV_OPTIMIZATION_FLAG_STRIP_REFLECTION)
    {
        // Decorations defined in SPV_GOOGLE_hlsl_functionality1 are the only instructions
        // removed by strip-reflect-info pass. SPIRV offsets become INVALID after this operation.
        SpirvOptimizer.RegisterPass(spvtools::CreateStripReflectInfoPass());
    }

    std::vector<uint32_t> OptimizedSPIRV;
    if (!SpirvOptimizer.Run(SrcSPIRV.data(), SrcSPIRV.size(), &OptimizedSPIRV, Options))
        OptimizedSPIRV.clear();

    return OptimizedSPIRV;
}